

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

void __thiscall
TxConfirmStats::removeTx
          (TxConfirmStats *this,uint entryHeight,uint nBestSeenHeight,uint bucketindex,bool inBlock)

{
  uint uVar1;
  ConstevalFormatString<0U> fmt;
  ConstevalFormatString<1U> fmt_00;
  ConstevalFormatString<2U> fmt_01;
  bool bVar2;
  undefined4 uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  size_t i;
  uint periodsAgo;
  int blocksAgo;
  Level in_stack_000000a0;
  uint *in_stack_000000b0;
  uint blockIndex;
  uint *in_stack_000000b8;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff00;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff18;
  ulong local_b8;
  LogFlags in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  int source_line;
  uint local_90;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  string_view in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffc0;
  long local_8;
  
  source_line = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_90 = in_EDX - in_ESI;
  if (in_EDX == 0) {
    local_90 = 0;
  }
  if ((int)local_90 < 0) {
    bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),Trace)
    ;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      fmt.fmt._4_4_ = in_stack_ffffffffffffffac;
      fmt.fmt._0_4_ = in_stack_ffffffffffffffa8;
      LogPrintFormatInternal<>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0,0,in_stack_ffffffffffffff60,
                 in_stack_000000a0,fmt);
    }
  }
  else {
    sVar4 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if ((int)local_90 < (int)sVar4) {
      sVar4 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      uVar3 = (undefined4)((ulong)in_ESI % sVar4);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)in_stack_ffffffffffffff08,(size_type)in_stack_ffffffffffffff00);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff08,
                          (size_type)in_stack_ffffffffffffff00);
      if (*pvVar5 < 1) {
        bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                    Trace);
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
          in_stack_ffffffffffffff08 =
               (vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffac;
          in_stack_fffffffffffffef8 = 1;
          in_stack_ffffffffffffff00 =
               "Blockpolicy error, mempool tx removed from blockIndex=%u,bucketIndex=%u already\n";
          fmt_01.fmt._4_4_ = uVar3;
          fmt_01.fmt._0_4_ = in_stack_ffffffffffffffa8;
          LogPrintFormatInternal<unsigned_int,unsigned_int>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0,source_line,
                     in_stack_ffffffffffffff60,in_stack_000000a0,fmt_01,in_stack_000000b0,
                     in_stack_000000b8);
        }
      }
      else {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)in_stack_ffffffffffffff08,(size_type)in_stack_ffffffffffffff00);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff08,
                            (size_type)in_stack_ffffffffffffff00);
        *pvVar5 = *pvVar5 + -1;
      }
    }
    else {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff08,
                          (size_type)in_stack_ffffffffffffff00);
      if (*pvVar5 < 1) {
        bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                    Trace);
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
          in_stack_ffffffffffffff08 =
               (vector<double,_std::allocator<double>_> *)&stack0xfffffffffffffff4;
          in_stack_fffffffffffffef8 = 1;
          in_stack_ffffffffffffff00 =
               "Blockpolicy error, mempool tx removed from >25 blocks,bucketIndex=%u already\n";
          fmt_00.fmt._4_4_ = in_stack_ffffffffffffffac;
          fmt_00.fmt._0_4_ = in_stack_ffffffffffffffa8;
          LogPrintFormatInternal<unsigned_int>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0,source_line,0x1d1b05e,
                     in_stack_000000a0,fmt_00,in_stack_000000b0);
        }
      }
      else {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff08,
                            (size_type)in_stack_ffffffffffffff00);
        *pvVar5 = *pvVar5 + -1;
      }
    }
    if (((in_R8B & 1) == 0) && (*(uint *)(in_RDI + 0x78) <= local_90)) {
      if (*(int *)(in_RDI + 0x78) == 0) {
        __assert_fail("scale != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                      ,0x1fe,
                      "void TxConfirmStats::removeTx(unsigned int, unsigned int, unsigned int, bool)"
                     );
      }
      uVar1 = *(uint *)(in_RDI + 0x78);
      local_b8 = 0;
      while( true ) {
        bVar2 = false;
        if (local_b8 < local_90 / uVar1) {
          sVar4 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          bVar2 = local_b8 < sVar4;
        }
        if (!bVar2) break;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)in_stack_ffffffffffffff08,(size_type)in_stack_ffffffffffffff00);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_stack_ffffffffffffff08,(size_type)in_stack_ffffffffffffff00);
        *pvVar6 = *pvVar6 + 1.0;
        local_b8 = local_b8 + 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TxConfirmStats::removeTx(unsigned int entryHeight, unsigned int nBestSeenHeight, unsigned int bucketindex, bool inBlock)
{
    //nBestSeenHeight is not updated yet for the new block
    int blocksAgo = nBestSeenHeight - entryHeight;
    if (nBestSeenHeight == 0)  // the BlockPolicyEstimator hasn't seen any blocks yet
        blocksAgo = 0;
    if (blocksAgo < 0) {
        LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, blocks ago is negative for mempool tx\n");
        return;  //This can't happen because we call this with our best seen height, no entries can have higher
    }

    if (blocksAgo >= (int)unconfTxs.size()) {
        if (oldUnconfTxs[bucketindex] > 0) {
            oldUnconfTxs[bucketindex]--;
        } else {
            LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, mempool tx removed from >25 blocks,bucketIndex=%u already\n",
                     bucketindex);
        }
    }
    else {
        unsigned int blockIndex = entryHeight % unconfTxs.size();
        if (unconfTxs[blockIndex][bucketindex] > 0) {
            unconfTxs[blockIndex][bucketindex]--;
        } else {
            LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, mempool tx removed from blockIndex=%u,bucketIndex=%u already\n",
                     blockIndex, bucketindex);
        }
    }
    if (!inBlock && (unsigned int)blocksAgo >= scale) { // Only counts as a failure if not confirmed for entire period
        assert(scale != 0);
        unsigned int periodsAgo = blocksAgo / scale;
        for (size_t i = 0; i < periodsAgo && i < failAvg.size(); i++) {
            failAvg[i][bucketindex]++;
        }
    }
}